

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sensors.cpp
# Opt level: O3

bool __thiscall iDynTree::JointSensor::isConsistent(JointSensor *this,Model *model)

{
  int iVar1;
  JointIndex JVar2;
  ostream *poVar3;
  undefined4 extraout_var;
  string local_68;
  long *local_48;
  long local_40;
  long local_38 [2];
  
  (*(this->super_Sensor)._vptr_Sensor[9])(&local_68,this);
  JVar2 = Model::getJointIndex(model,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (JVar2 == JOINT_INVALID_INDEX) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"[ERROR] Sensor ",0xf);
    (*(this->super_Sensor)._vptr_Sensor[2])(&local_68,this);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,local_68._M_dataplus._M_p,local_68._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3," is not consistent because the joint ",0x25);
    (*(this->super_Sensor)._vptr_Sensor[9])(&local_48,this);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)local_48,local_40);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3," does not exist in the specified model",0x26);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
  }
  else {
    iVar1 = (*(this->super_Sensor)._vptr_Sensor[10])(this);
    if (JVar2 == CONCAT44(extraout_var,iVar1)) {
      return true;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"[ERROR] Sensor ",0xf);
    (*(this->super_Sensor)._vptr_Sensor[2])(&local_68,this);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,local_68._M_dataplus._M_p,local_68._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3," is not consistent because it is attached to joint ",0x33);
    (*(this->super_Sensor)._vptr_Sensor[9])(&local_48,this);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)local_48,local_40);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," that has index ",0x10);
    poVar3 = std::ostream::_M_insert<long>((long)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3," in the model, while the sensor ",0x20);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," has it saved with link index ",0x1e)
    ;
    (*(this->super_Sensor)._vptr_Sensor[10])(this);
    poVar3 = std::ostream::_M_insert<long>((long)poVar3);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
  }
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  return false;
}

Assistant:

bool JointSensor::isConsistent(const Model& model) const
{
    LinkIndex jntIdxInModel = model.getJointIndex(this->getParentJoint());

    if (jntIdxInModel == JOINT_INVALID_INDEX)
    {
        std::cerr << "[ERROR] Sensor " << this->getName() << " is not consistent because the joint "
                  << this->getParentJoint() << " does not exist in the specified model" << std::endl;
        return false;
    }

    if (jntIdxInModel != this->getParentJointIndex())
    {
        std::cerr << "[ERROR] Sensor " << this->getName() << " is not consistent because it is attached to joint "
                  << this->getParentJoint() << " that has index " << jntIdxInModel << " in the model, while the sensor "
                  << " has it saved with link index " << this->getParentJointIndex() << std::endl;
        return false;
    }

    return true;
}